

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.c
# Opt level: O3

ZyanStatus
ZydisFormatterTokenizeOperand
          (ZydisFormatter *formatter,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operand,void *buffer,ZyanUSize length,ZyanU64 runtime_address,
          ZydisFormatterTokenConst **token,void *user_data)

{
  void *pvVar1;
  undefined4 in_EAX;
  int iVar2;
  ZyanStatus ZVar3;
  ZydisFormatterTokenConst *pZVar4;
  undefined1 auVar5 [16];
  ZydisFormatterBuffer formatter_buffer;
  ZydisFormatterContext local_98;
  ZydisFormatterBuffer local_70;
  
  auVar5._0_4_ = -(uint)(formatter == (ZydisFormatter *)0x0);
  auVar5._4_4_ = -(uint)(instruction == (ZydisDecodedInstruction *)0x0);
  auVar5._8_4_ = -(uint)(operand == (ZydisDecodedOperand *)0x0);
  auVar5._12_4_ = -(uint)(buffer == (void *)0x0);
  iVar2 = movmskps(in_EAX,auVar5);
  ZVar3 = 0x80100004;
  if ((token != (ZydisFormatterTokenConst **)0x0 && 2 < length) && iVar2 == 0) {
    *(undefined2 *)buffer = 0;
    pvVar1 = (void *)((long)buffer + 2);
    local_70.capacity = length - 2;
    local_70.is_token_list = '\x01';
    local_70.string.flags = '\x01';
    local_70.string.vector.allocator = (ZyanAllocator *)0x0;
    local_70.string.vector.growth_factor = '\x01';
    local_70.string.vector.shrink_threshold = '\0';
    local_70.string.vector.destructor = (ZyanMemberProcedure)0x0;
    local_70.string.vector.element_size = 1;
    local_70.string.vector.size = 1;
    *(undefined1 *)((long)buffer + 2) = 0;
    local_98.operands = (ZydisDecodedOperand *)0x0;
    local_98.user_data = user_data;
    local_98.instruction = instruction;
    local_98.operand = operand;
    local_98.runtime_address = runtime_address;
    local_70.string.vector.capacity = local_70.capacity;
    local_70.string.vector.data = pvVar1;
    if ((formatter->func_pre_operand == (ZydisFormatterFunc)0x0) ||
       (ZVar3 = (*formatter->func_pre_operand)(formatter,&local_70,&local_98), -1 < (int)ZVar3)) {
      switch((local_98.operand)->type) {
      case ZYDIS_OPERAND_TYPE_REGISTER:
        ZVar3 = (*formatter->func_format_operand_reg)(formatter,&local_70,&local_98);
        break;
      case ZYDIS_OPERAND_TYPE_MEMORY:
        ZVar3 = (*formatter->func_format_operand_mem)(formatter,&local_70,&local_98);
        break;
      case ZYDIS_OPERAND_TYPE_POINTER:
        ZVar3 = (*formatter->func_format_operand_ptr)(formatter,&local_70,&local_98);
        break;
      case ZYDIS_OPERAND_TYPE_IMMEDIATE:
        ZVar3 = (*formatter->func_format_operand_imm)(formatter,&local_70,&local_98);
        break;
      default:
        return 0x80100004;
      }
      if ((-1 < (int)ZVar3) &&
         ((formatter->func_post_operand == (ZydisFormatterFunc)0x0 ||
          (ZVar3 = (*formatter->func_post_operand)(formatter,&local_70,&local_98), -1 < (int)ZVar3))
         )) {
        pZVar4 = (ZydisFormatterTokenConst *)((long)pvVar1 + (ulong)*(byte *)((long)buffer + 1));
        if ((ulong)*(byte *)((long)buffer + 1) == 0) {
          pZVar4 = (ZydisFormatterTokenConst *)buffer;
        }
        *token = pZVar4;
        ZVar3 = 0x100000;
      }
    }
  }
  return ZVar3;
}

Assistant:

ZyanStatus ZydisFormatterTokenizeOperand(const ZydisFormatter* formatter,
    const ZydisDecodedInstruction* instruction, const ZydisDecodedOperand* operand,
    void* buffer, ZyanUSize length, ZyanU64 runtime_address, ZydisFormatterTokenConst** token,
    void* user_data)
{
    if (!formatter || !instruction || !operand || !buffer ||
        (length <= sizeof(ZydisFormatterToken)) || !token)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZydisFormatterToken* first_token;
    ZydisFormatterBuffer formatter_buffer;
    ZydisFormatterBufferInitTokenized(&formatter_buffer, &first_token, buffer, length);

    ZydisFormatterContext context;
    context.instruction     = instruction;
    context.operands        = ZYAN_NULL;
    context.runtime_address = runtime_address;
    context.operand         = operand;
    context.user_data       = user_data;

    // We ignore `ZYDIS_STATUS_SKIP_TOKEN` for all operand-functions as it does not make any sense
    // to skip the only operand printed by this function

    if (formatter->func_pre_operand)
    {
        ZYAN_CHECK(formatter->func_pre_operand(formatter, &formatter_buffer, &context));
    }

    switch (context.operand->type)
    {
    case ZYDIS_OPERAND_TYPE_REGISTER:
        ZYAN_CHECK(formatter->func_format_operand_reg(formatter, &formatter_buffer, &context));
        break;
    case ZYDIS_OPERAND_TYPE_MEMORY:
        ZYAN_CHECK(formatter->func_format_operand_mem(formatter, &formatter_buffer, &context));
        break;
    case ZYDIS_OPERAND_TYPE_IMMEDIATE:
        ZYAN_CHECK(formatter->func_format_operand_imm(formatter, &formatter_buffer, &context));
        break;
    case ZYDIS_OPERAND_TYPE_POINTER:
        ZYAN_CHECK(formatter->func_format_operand_ptr(formatter, &formatter_buffer, &context));
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (formatter->func_post_operand)
    {
        ZYAN_CHECK(formatter->func_post_operand(formatter, &formatter_buffer, &context));
    }

    if (first_token->next)
    {
        *token = (ZydisFormatterTokenConst*)((ZyanU8*)first_token + sizeof(ZydisFormatterToken) +
            first_token->next);
        return ZYAN_STATUS_SUCCESS;
    }

    *token = first_token;
    return ZYAN_STATUS_SUCCESS;
}